

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

char * transform_iffeat_schema2json(lys_module *module,char *expr)

{
  int iVar1;
  size_t sVar2;
  LY_ERR *pLVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  lys_module *plVar7;
  char *pcVar8;
  lys_module *mod;
  size_t rc;
  size_t id_len;
  size_t out_used;
  size_t out_size;
  char *col;
  char *out;
  char *id;
  char *in;
  char *expr_local;
  lys_module *module_local;
  
  sVar2 = strlen(expr);
  out_used = sVar2 + 1;
  col = (char *)malloc(out_used);
  if (col == (char *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_iffeat_schema2json");
    module_local = (lys_module *)0x0;
  }
  else {
    id_len = 0;
    id = expr;
    while (pcVar4 = strchr(id,0x3a), pcVar4 != (char *)0x0) {
      out = strpbrk_backwards(pcVar4 + -1,"/ [\'\"",((int)pcVar4 - (int)id) - 1);
      if ((((*out == '/') || (*out == ' ')) || (*out == '[')) || ((*out == '\'' || (*out == '\"'))))
      {
        out = out + 1;
      }
      uVar5 = (long)pcVar4 - (long)out;
      iVar1 = parse_identifier(out);
      uVar6 = (ulong)iVar1;
      if (uVar6 < uVar5) {
        ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)out[uVar6],out + uVar6);
        free(col);
        return (char *)0x0;
      }
      plVar7 = lys_get_import_module(module,out,(int)uVar5,(char *)0x0,0);
      if (plVar7 == (lys_module *)0x0) {
        ly_vlog(LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,uVar5,out);
        free(col);
        return (char *)0x0;
      }
      sVar2 = strlen(plVar7->name);
      out_used = (sVar2 - uVar5) + out_used;
      col = (char *)ly_realloc(col,out_used);
      if (col == (char *)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_iffeat_schema2json");
        return (char *)0x0;
      }
      strncpy(col + id_len,id,(long)out - (long)id);
      pcVar8 = out + (id_len - (long)id);
      strcpy(col + (long)pcVar8,plVar7->name);
      sVar2 = strlen(plVar7->name);
      col[(long)(pcVar8 + sVar2)] = ':';
      id_len = (size_t)(pcVar8 + sVar2 + 1);
      id = pcVar4 + 1;
    }
    strcpy(col + id_len,id);
    sVar2 = strlen(id);
    if (out_used != sVar2 + 1 + id_len) {
      __assert_fail("out_size == out_used",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/common.c"
                    ,0x330,
                    "const char *transform_iffeat_schema2json(const struct lys_module *, const char *)"
                   );
    }
    module_local = (lys_module *)lydict_insert_zc(module->ctx,col);
  }
  return (char *)module_local;
}

Assistant:

const char *
transform_iffeat_schema2json(const struct lys_module *module, const char *expr)
{
    const char *in, *id;
    char *out, *col;
    size_t out_size, out_used, id_len, rc;
    const struct lys_module *mod;

    in = expr;
    out_size = strlen(in) + 1;
    out = malloc(out_size);
    if (!out) {
        LOGMEM;
        return NULL;
    }
    out_used = 0;

    while (1) {
        col = strchr(in, ':');
        /* we're finished, copy the remaining part */
        if (!col) {
            strcpy(&out[out_used], in);
            out_used += strlen(in) + 1;
            assert(out_size == out_used);
            return lydict_insert_zc(module->ctx, out);
        }
        id = strpbrk_backwards(col - 1, "/ [\'\"", (col - in) - 1);
        if ((id[0] == '/') || (id[0] == ' ') || (id[0] == '[') || (id[0] == '\'') || (id[0] == '\"')) {
            ++id;
        }
        id_len = col - id;
        rc = parse_identifier(id);
        if (rc < id_len) {
            LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, id[rc], &id[rc]);
            free(out);
            return NULL;
        }

        /* get the module */
        mod = lys_get_import_module(module, id, id_len, NULL, 0);
        if (!mod) {
            LOGVAL(LYE_INMOD_LEN, LY_VLOG_NONE, NULL, id_len, id);
            free(out);
            return NULL;
        }

        /* adjust out size (it can even decrease in some strange cases) */
        out_size += strlen(mod->name) - id_len;
        out = ly_realloc(out, out_size);
        if (!out) {
            LOGMEM;
            return NULL;
        }

        /* copy the data before prefix */
        strncpy(&out[out_used], in, id - in);
        out_used += id - in;

        /* copy the model name */
        strcpy(&out[out_used], mod->name);
        out_used += strlen(mod->name);

        /* copy ':' */
        out[out_used] = ':';
        ++out_used;

        /* finally adjust in pointer for next round */
        in = col + 1;
    }

    /* unreachable */
    LOGINT;
    return NULL;
}